

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O0

CBan<NETADDR> * __thiscall
CNetBan::CBanPool<NETADDR,_1>::Add
          (CBanPool<NETADDR,_1> *this,CDataType *pData,CBanInfo *pInfo,CNetHash *pNetHash)

{
  undefined8 uVar1;
  CNetHash *in_RCX;
  int *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  CBan<NETADDR> *p;
  CBan<NETADDR> *pBan;
  CBan<NETADDR> *local_38;
  CBan<NETADDR> *local_8;
  
  if (*(long *)(in_RDI + 0x22800) == 0) {
    local_8 = (CBan<NETADDR> *)0x0;
  }
  else {
    local_8 = *(CBan<NETADDR> **)(in_RDI + 0x22800);
    uVar1 = *in_RSI;
    (local_8->m_Data).type = (int)uVar1;
    (local_8->m_Data).ip[0] = (char)((ulong)uVar1 >> 0x20);
    (local_8->m_Data).ip[1] = (char)((ulong)uVar1 >> 0x28);
    (local_8->m_Data).ip[2] = (char)((ulong)uVar1 >> 0x30);
    (local_8->m_Data).ip[3] = (char)((ulong)uVar1 >> 0x38);
    *(undefined8 *)((local_8->m_Data).ip + 4) = in_RSI[1];
    *(undefined8 *)((local_8->m_Data).ip + 0xc) = in_RSI[2];
    memcpy(&local_8->m_Info,in_RDX,0x48);
    local_8->m_NetHash = *in_RCX;
    if (local_8->m_pNext != (CBan<NETADDR> *)0x0) {
      local_8->m_pNext->m_pPrev = local_8->m_pPrev;
    }
    if (local_8->m_pPrev == (CBan<NETADDR> *)0x0) {
      *(CBan<NETADDR> **)(in_RDI + 0x22800) = local_8->m_pNext;
    }
    else {
      local_8->m_pPrev->m_pNext = local_8->m_pNext;
    }
    if (*(long *)(in_RDI + (long)in_RCX->m_HashIndex * 0x800 + (long)in_RCX->m_Hash * 8) != 0) {
      *(CBan<NETADDR> **)
       (*(long *)(in_RDI + (long)in_RCX->m_HashIndex * 0x800 + (long)in_RCX->m_Hash * 8) + 0x70) =
           local_8;
    }
    local_8->m_pHashPrev = (CBan<NETADDR> *)0x0;
    local_8->m_pHashNext =
         *(CBan<NETADDR> **)(in_RDI + (long)in_RCX->m_HashIndex * 0x800 + (long)in_RCX->m_Hash * 8);
    *(CBan<NETADDR> **)(in_RDI + (long)in_RCX->m_HashIndex * 0x800 + (long)in_RCX->m_Hash * 8) =
         local_8;
    if (*(long *)(in_RDI + 0x22808) == 0) {
      *(CBan<NETADDR> **)(in_RDI + 0x22808) = local_8;
      local_8->m_pPrev = (CBan<NETADDR> *)0x0;
      local_8->m_pNext = (CBan<NETADDR> *)0x0;
    }
    else {
      for (local_38 = *(CBan<NETADDR> **)(in_RDI + 0x22808);
          ((local_38->m_Info).m_Expires != -1 &&
          ((*in_RDX == -1 || ((local_38->m_Info).m_Expires < *in_RDX))));
          local_38 = local_38->m_pNext) {
        if (local_38->m_pNext == (CBan<NETADDR> *)0x0) {
          local_38->m_pNext = local_8;
          local_8->m_pPrev = local_38;
          local_8->m_pNext = (CBan<NETADDR> *)0x0;
          goto LAB_00153d23;
        }
      }
      local_8->m_pNext = local_38;
      local_8->m_pPrev = local_38->m_pPrev;
      if (local_38->m_pPrev == (CBan<NETADDR> *)0x0) {
        *(CBan<NETADDR> **)(in_RDI + 0x22808) = local_8;
      }
      else {
        local_38->m_pPrev->m_pNext = local_8;
      }
      local_38->m_pPrev = local_8;
    }
LAB_00153d23:
    *(int *)(in_RDI + 0x22810) = *(int *)(in_RDI + 0x22810) + 1;
  }
  return local_8;
}

Assistant:

typename CNetBan::CBan<T> *CNetBan::CBanPool<T, HashCount>::Add(const T *pData, const CBanInfo *pInfo,  const CNetHash *pNetHash)
{
	if(!m_pFirstFree)
		return 0;

	// create new ban
	CBan<T> *pBan = m_pFirstFree;
	pBan->m_Data = *pData;
	pBan->m_Info = *pInfo;
	pBan->m_NetHash = *pNetHash;
	if(pBan->m_pNext)
		pBan->m_pNext->m_pPrev = pBan->m_pPrev;
	if(pBan->m_pPrev)
		pBan->m_pPrev->m_pNext = pBan->m_pNext;
	else
		m_pFirstFree = pBan->m_pNext;

	// add it to the hash list
	if(m_paaHashList[pNetHash->m_HashIndex][pNetHash->m_Hash])
		m_paaHashList[pNetHash->m_HashIndex][pNetHash->m_Hash]->m_pHashPrev = pBan;
	pBan->m_pHashPrev = 0;
	pBan->m_pHashNext = m_paaHashList[pNetHash->m_HashIndex][pNetHash->m_Hash];
	m_paaHashList[pNetHash->m_HashIndex][pNetHash->m_Hash] = pBan;

	// insert it into the used list
	if(m_pFirstUsed)
	{
		for(CBan<T> *p = m_pFirstUsed; ; p = p->m_pNext)
		{
			if(p->m_Info.m_Expires == CBanInfo::EXPIRES_NEVER || (pInfo->m_Expires != CBanInfo::EXPIRES_NEVER && pInfo->m_Expires <= p->m_Info.m_Expires))
			{
				// insert before
				pBan->m_pNext = p;
				pBan->m_pPrev = p->m_pPrev;
				if(p->m_pPrev)
					p->m_pPrev->m_pNext = pBan;
				else
					m_pFirstUsed = pBan;
				p->m_pPrev = pBan;
				break;
			}

			if(!p->m_pNext)
			{
				// last entry
				p->m_pNext = pBan;
				pBan->m_pPrev = p;
				pBan->m_pNext = 0;
				break;
			}
		}
	}
	else
	{
		m_pFirstUsed = pBan;
		pBan->m_pNext = pBan->m_pPrev = 0;
	}

	// update ban count
	++m_CountUsed;

	return pBan;
}